

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::processImplicitActions
          (SimpleParser<avro::parsing::DummyHandler> *this)

{
  bool bVar1;
  reference this_00;
  long in_RDI;
  Symbol *s;
  
  while( true ) {
    this_00 = std::
              stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
              ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x29ab5f);
    bVar1 = Symbol::isImplicitAction(this_00);
    if (!bVar1) break;
    DummyHandler::handle(*(DummyHandler **)(in_RDI + 8),this_00);
    std::
    stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
           *)0x29ab93);
  }
  return;
}

Assistant:

void processImplicitActions() {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.isImplicitAction()) {
                handler_.handle(s);
                parsingStack.pop();
            } else {
                break;
            }
        }
    }